

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

int has_ext(char *ext)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *in_RDI;
  char *e;
  int index;
  char *terminator;
  char *loc;
  char *extensions;
  int local_2c;
  char *local_18;
  int local_4;
  
  if (max_loaded_major < 3) {
    local_18 = exts;
    if ((exts == (char *)0x0) || (in_RDI == (char *)0x0)) {
      local_4 = 0;
    }
    else {
      do {
        pcVar2 = strstr(local_18,in_RDI);
        if (pcVar2 == (char *)0x0) {
          return 0;
        }
        sVar3 = strlen(in_RDI);
        pcVar4 = pcVar2 + sVar3;
      } while (((pcVar2 != local_18) && (local_18 = pcVar4, pcVar2[-1] != ' ')) ||
              ((*pcVar4 != ' ' && (local_18 = pcVar4, *pcVar4 != '\0'))));
      local_4 = 1;
    }
  }
  else if (exts_i == (char **)0x0) {
    local_4 = 0;
  }
  else {
    for (local_2c = 0; local_2c < num_exts_i; local_2c = local_2c + 1) {
      if ((exts_i[local_2c] != (char *)0x0) && (iVar1 = strcmp(exts_i[local_2c],in_RDI), iVar1 == 0)
         ) {
        return 1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int has_ext(const char *ext) {
#ifdef _GLAD_IS_SOME_NEW_VERSION
    if(max_loaded_major < 3) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = exts;
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#ifdef _GLAD_IS_SOME_NEW_VERSION
    } else {
        int index;
        if(exts_i == NULL) return 0;
        for(index = 0; index < num_exts_i; index++) {
            const char *e = exts_i[index];

            if(exts_i[index] != NULL && strcmp(e, ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}